

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInstancedRenderingTests.cpp
# Opt level: O2

void vkt::geometry::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,TestParams_conflict params)

{
  deUint32 dVar1;
  TestType TVar2;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  ostream *poVar6;
  int precision;
  int iVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  allocator<char> local_551;
  long local_550;
  VkImageViewType local_544;
  string local_540;
  string padding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  Vector<float,_4> local_4c8;
  string local_4b8 [32];
  ostringstream src;
  string local_490 [368];
  ostringstream src_1;
  string local_318 [368];
  ostringstream colorTable;
  
  TVar2 = params.testType;
  bVar9 = params.testType == TEST_TYPE_ALL_LAYERS;
  bVar10 = params.testType == TEST_TYPE_INVOCATION_PER_LAYER;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar4 = std::operator<<((ostream *)&src,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main(void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorTable,"vert",(allocator<char> *)&padding);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)&colorTable);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)&src_1,&local_540);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src_1);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&colorTable);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  dVar1 = (&params.image.size.depth)[params.image.viewType != VK_IMAGE_VIEW_TYPE_3D];
  local_544 = params.image.viewType;
  if ((TVar2 == TEST_TYPE_ALL_LAYERS) || (TVar2 == TEST_TYPE_LAYER_ID)) {
    iVar7 = dVar1 * 4;
  }
  else if (TVar2 == TEST_TYPE_DIFFERENT_CONTENT) {
    iVar7 = (dVar1 + 1) * dVar1;
  }
  else {
    iVar7 = (uint)(TVar2 == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION) * 2 + 4;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src_1);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar4 = (ostream *)&src_1;
  poVar6 = std::operator<<(poVar4,pcVar3);
  poVar6 = std::operator<<(poVar6,"\n");
  std::operator<<(poVar6,"\n");
  if (TVar2 - TEST_TYPE_INVOCATION_PER_LAYER < 2) {
    poVar4 = std::operator<<((ostream *)&src_1,"layout(points, invocations = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    pcVar3 = ") in;\n";
  }
  else {
    pcVar3 = "layout(points) in;\n";
  }
  std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<((ostream *)&src_1,"layout(triangle_strip, max_vertices = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
  poVar4 = std::operator<<(poVar4,") out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  pcVar3 = "layout(location = 0) out vec4 vert_color;\n\n";
  if (!bVar9 && !bVar10) {
    pcVar3 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"out gl_PerVertex {\n");
  poVar4 = std::operator<<(poVar4,"    vec4 gl_Position;\n");
  poVar4 = std::operator<<(poVar4,"};\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main(void)\n");
  std::operator<<(poVar4,"{\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorTable);
  poVar4 = std::operator<<((ostream *)&colorTable,"    const vec4 colors[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,6);
  poVar4 = std::operator<<(poVar4,"] = vec4[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,6);
  std::operator<<(poVar4,"](");
  std::__cxx11::stringbuf::str();
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  std::__cxx11::string::_M_construct((ulong)&padding,(char)local_490[0]);
  std::__cxx11::string::~string((string *)&src);
  lVar8 = 0;
  while (lVar8 != 6) {
    local_550 = lVar8;
    if (lVar8 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"",&local_551);
    }
    else {
      std::operator+(&local_4e8,",\n",&padding);
    }
    poVar4 = std::operator<<((ostream *)&colorTable,(string *)&local_4e8);
    tcu::Vector<float,_4>::Vector
              (&local_4c8,
               (float (*) [4])(geometry::(anonymous_namespace)::s_colors + local_550 * 0x10));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    std::operator<<((ostream *)&src,"vec4(");
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      pcVar3 = ", ";
      if (lVar8 == 0) {
        pcVar3 = "";
      }
      poVar6 = std::operator<<((ostream *)&src,pcVar3);
      de::floatToString_abi_cxx11_(&local_540,(de *)0x1,local_4c8.m_data[lVar8],precision);
      std::operator<<(poVar6,(string *)&local_540);
      std::__cxx11::string::~string((string *)&local_540);
    }
    std::operator<<((ostream *)&src,")");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    std::operator<<(poVar4,local_4b8);
    std::__cxx11::string::~string(local_4b8);
    std::__cxx11::string::~string((string *)&local_4e8);
    lVar8 = local_550 + 1;
  }
  std::operator<<((ostream *)&colorTable,");\n");
  std::__cxx11::string::~string((string *)&padding);
  switch(TVar2) {
  case TEST_TYPE_DEFAULT_LAYER:
    poVar4 = std::operator<<((ostream *)&src_1,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    pcVar3 = "    EmitVertex();\n";
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    break;
  case TEST_TYPE_SINGLE_LAYER:
    poVar4 = std::operator<<((ostream *)&src_1,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,";\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,";\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,";\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,";\n");
    std::operator<<(poVar4,"    EmitVertex();\n");
    goto switchD_008a52da_default;
  case TEST_TYPE_ALL_LAYERS:
    std::__cxx11::stringbuf::str();
    poVar4 = std::operator<<((ostream *)&src_1,(string *)&src);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    for (int layerNdx = 0; layerNdx < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    poVar4 = std::operator<<(poVar4,"; ++layerNdx) {\n");
    poVar4 = std::operator<<(poVar4,"        const int colorNdx = layerNdx % ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,6);
    poVar4 = std::operator<<(poVar4,";\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"        EndPrimitive();\n");
    std::operator<<(poVar4,"    };\n");
    goto LAB_008a5a86;
  case TEST_TYPE_DIFFERENT_CONTENT:
    poVar4 = std::operator<<((ostream *)&src_1,"    for (int layerNdx = 0; layerNdx < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    poVar4 = std::operator<<(poVar4,"; ++layerNdx) {\n");
    poVar4 = std::operator<<(poVar4,"        for (int colNdx = 0; colNdx <= layerNdx; ++colNdx) {\n"
                            );
    poVar4 = std::operator<<(poVar4,"            const float posX = float(colNdx) / float(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    poVar4 = std::operator<<(poVar4,") * 2.0 - 1.0;\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"            gl_Position = vec4(posX,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"            gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"            EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"            gl_Position = vec4(posX, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"            gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"            EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"        }\n");
    poVar4 = std::operator<<(poVar4,"        EndPrimitive();\n");
    pcVar3 = "    }\n";
    break;
  case TEST_TYPE_LAYER_ID:
    poVar4 = std::operator<<((ostream *)&src_1,"    for (int layerNdx = 0; layerNdx < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    poVar4 = std::operator<<(poVar4,"; ++layerNdx) {\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        gl_Layer    = layerNdx;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"        EndPrimitive();\n");
    pcVar3 = "    };\n";
    break;
  case TEST_TYPE_INVOCATION_PER_LAYER:
    std::__cxx11::stringbuf::str();
    poVar4 = std::operator<<((ostream *)&src_1,(string *)&src);
    poVar4 = std::operator<<(poVar4,"    const int colorNdx = gl_InvocationID % ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,6);
    poVar4 = std::operator<<(poVar4,";\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = gl_InvocationID;\n");
    poVar4 = std::operator<<(poVar4,"    vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = gl_InvocationID;\n");
    poVar4 = std::operator<<(poVar4,"    vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = gl_InvocationID;\n");
    poVar4 = std::operator<<(poVar4,"    vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = gl_InvocationID;\n");
    poVar4 = std::operator<<(poVar4,"    vert_color  = colors[colorNdx];\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    std::operator<<(poVar4,"    EndPrimitive();\n");
LAB_008a5a86:
    std::__cxx11::string::~string((string *)&src);
    goto switchD_008a52da_default;
  case TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION:
    poVar4 = std::operator<<((ostream *)&src_1,"    const int   layerA = gl_InvocationID;\n");
    poVar4 = std::operator<<(poVar4,"    const int   layerB = (gl_InvocationID + 1) % ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    poVar4 = std::operator<<(poVar4,";\n");
    poVar4 = std::operator<<(poVar4,"    const float aEnd   = float(layerA) / float(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    poVar4 = std::operator<<(poVar4,") * 2.0 - 1.0;\n");
    poVar4 = std::operator<<(poVar4,"    const float bEnd   = float(layerB) / float(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
    poVar4 = std::operator<<(poVar4,") * 2.0 - 1.0;\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = layerA;\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = layerA;\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = layerA;\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    pcVar3 = "    EndPrimitive();\n";
    poVar4 = std::operator<<(poVar4,"    EndPrimitive();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = layerB;\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = layerB;\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"    gl_Layer    = layerB;\n");
    poVar4 = std::operator<<(poVar4,"    EmitVertex();\n");
    break;
  default:
    goto switchD_008a52da_default;
  }
  std::operator<<(poVar4,pcVar3);
switchD_008a52da_default:
  std::operator<<((ostream *)&src_1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"geom",(allocator<char> *)&local_4e8);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_540);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)&src,&padding);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src);
  std::__cxx11::string::~string(local_490);
  std::__cxx11::string::~string((string *)&padding);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorTable);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src_1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar4 = (ostream *)&src;
  poVar6 = std::operator<<(poVar4,pcVar3);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) out vec4 o_color;\n");
  pcVar3 = "";
  if (bVar9 || bVar10) {
    pcVar3 = "layout(location = 0) in  vec4 vert_color;\n";
  }
  poVar6 = std::operator<<(poVar6,pcVar3);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"void main(void)\n");
  std::operator<<(poVar6,"{\n");
  if (params.testType == TEST_TYPE_LAYER_ID) {
    poVar4 = std::operator<<((ostream *)&src,
                             "    o_color = vec4( (gl_Layer    % 2) == 1 ? 1.0 : 0.5,\n");
    poVar4 = std::operator<<(poVar4,"                   ((gl_Layer/2) % 2) == 1 ? 1.0 : 0.5,\n");
    poVar4 = std::operator<<(poVar4,"                     gl_Layer         == 0 ? 1.0 : 0.0,\n");
    pcVar3 = "                                             1.0);\n";
  }
  else {
    pcVar3 = "    o_color = vert_color;\n";
    if ((TVar2 != TEST_TYPE_ALL_LAYERS) && (TVar2 != TEST_TYPE_INVOCATION_PER_LAYER)) {
      pcVar3 = "    o_color = vec4(1.0);\n";
    }
  }
  std::operator<<(poVar4,pcVar3);
  std::operator<<((ostream *)&src,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorTable,"frag",(allocator<char> *)&padding);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)&colorTable);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&src_1,&local_540);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src_1);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&colorTable);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const TestParams params)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 in_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Geometry shader
	{
		// The shader must be in sync with reference image rendering routine.

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(points, invocations = " << params.numInvocations << ") in;\n"
			<< "layout(triangle_strip, max_vertices = 4) out;\n"
			<< "\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "in gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "} gl_in[];\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    const vec4  pos       = gl_in[0].gl_Position;\n"
			<< "    const float modifier  = " << (params.numInvocations > 1 ? "float(gl_InvocationID) / float(" + de::toString(params.numInvocations - 1) + ")" : "0.0") << ";\n"
			<< "    const vec4  color     = vec4(abs(pos.x), abs(pos.y), 0.2 + 0.8 * modifier, 1.0);\n"
			<< "    const float size      = 0.05 + 0.03 * modifier;\n"
			<< "    const float dx        = (sign(-pos.x) - pos.x) / float(" << params.numInvocations << ");\n"
			<< "    const vec4  offsetPos = pos + vec4(float(gl_InvocationID) * dx,\n"
			<< "                                       0.3 * sin(12.0 * modifier),\n"
			<< "                                       0.0,\n"
			<< "                                       0.0);\n"
			<< "\n"
			<< "    gl_Position = offsetPos + vec4(-size, -size, 0.0, 0.0);\n"
			<< "    out_color   = color;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = offsetPos + vec4(-size,  size, 0.0, 0.0);\n"
			<< "    out_color   = color;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = offsetPos + vec4( size, -size, 0.0, 0.0);\n"
			<< "    out_color   = color;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = offsetPos + vec4( size,  size, 0.0, 0.0);\n"
			<< "    out_color   = color;\n"
			<< "    EmitVertex();\n"
			<<	"}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}